

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O1

void dispose_chunk(mstate m,mchunkptr p,size_t psize)

{
  tbinptr pmVar1;
  mchunkptr pmVar2;
  malloc_tree_chunk *pmVar3;
  bool bVar4;
  malloc_tree_chunk *pmVar5;
  int iVar6;
  uint uVar7;
  malloc_tree_chunk **ppmVar8;
  malloc_tree_chunk *pmVar9;
  mstate pmVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  tbinptr pmVar14;
  char *pcVar15;
  ulong uVar16;
  
  pmVar1 = (tbinptr)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk);
  if ((m->dvsize & 1) == 0) {
    uVar16 = *(ulong *)m;
    if ((m->dvsize & 2) == 0) {
      p = (mchunkptr)((long)&p[1].prev_foot + uVar16);
      iVar6 = munmap((void *)((long)m - uVar16),(size_t)p);
      if (iVar6 == 0) {
        _gm_.footprint = _gm_.footprint - (long)p;
      }
LAB_001067e3:
      bVar4 = false;
    }
    else {
      m = (mstate)((long)m - uVar16);
      if (m < _gm_.least_addr) goto LAB_00106d81;
      p = (mchunkptr)((long)&p->prev_foot + uVar16);
      if (m == (mstate)_gm_.dv) {
        bVar4 = true;
        if ((~(uint)pmVar1->head & 3) == 0) {
          _gm_.dvsize = (size_t)p;
          pmVar1->head = pmVar1->head & 0xfffffffffffffffe;
          m->dvsize = (ulong)p | 1;
          pmVar1->prev_foot = (size_t)p;
          goto LAB_001067e3;
        }
      }
      else {
        if (0xff < uVar16) {
          pmVar10 = (mstate)m->least_addr;
          pmVar9 = (malloc_tree_chunk *)m->trim_check;
          if (pmVar10 == m) {
            pmVar10 = (mstate)m->top;
            if (pmVar10 != (mstate)0x0) {
              ppmVar8 = (malloc_tree_chunk **)&m->top;
LAB_00106863:
              do {
                if (pmVar10->top == (mchunkptr)0x0) {
                  if ((malloc_tree_chunk *)pmVar10->dv == (malloc_tree_chunk *)0x0)
                  goto code_r0x00106877;
                  ppmVar8 = (malloc_tree_chunk **)&pmVar10->dv;
                }
                else {
                  ppmVar8 = (malloc_tree_chunk **)&pmVar10->top;
                }
                pmVar10 = (mstate)*ppmVar8;
              } while( true );
            }
            pmVar10 = (mstate)m->dv;
            if (pmVar10 != (mstate)0x0) {
              ppmVar8 = (malloc_tree_chunk **)&m->dv;
              goto LAB_00106863;
            }
            pmVar10 = (mstate)0x0;
          }
          else {
            pmVar3 = (malloc_tree_chunk *)m->topsize;
            if (((pmVar3 < _gm_.least_addr) || ((mstate)pmVar3->bk != m)) ||
               ((mstate)pmVar10->topsize != m)) goto LAB_00106d81;
            pmVar3->bk = (malloc_tree_chunk *)pmVar10;
            pmVar10->topsize = (size_t)pmVar3;
          }
          goto LAB_00106887;
        }
        pmVar9 = (malloc_tree_chunk *)m->topsize;
        pmVar3 = (malloc_tree_chunk *)m->least_addr;
        if ((pmVar9 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar16 >> 3) * 2)) &&
           ((pmVar9 < _gm_.least_addr || ((mstate)pmVar9->bk != m)))) goto LAB_00106d81;
        if (pmVar3 == pmVar9) {
          bVar11 = (byte)(uVar16 >> 3) & 0x1f;
          _gm_.smallmap = _gm_.smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
        }
        else {
          if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar16 >> 3) * 2)) &&
             ((pmVar3 < _gm_.least_addr || ((mstate)pmVar3->fd != m)))) goto LAB_00106d81;
          pmVar9->bk = pmVar3;
          pmVar3->fd = pmVar9;
        }
        bVar4 = true;
      }
    }
    goto LAB_0010692d;
  }
  goto LAB_00106936;
code_r0x00106c9b:
  if (ppmVar8 < _gm_.least_addr) goto LAB_00106d81;
  *ppmVar8 = (malloc_tree_chunk *)0x0;
  goto LAB_00106cab;
code_r0x00106877:
  if (ppmVar8 < _gm_.least_addr) goto LAB_00106d81;
  *ppmVar8 = (malloc_tree_chunk *)0x0;
LAB_00106887:
  bVar4 = true;
  if (pmVar9 == (malloc_tree_chunk *)0x0) goto LAB_0010692d;
  uVar7 = (uint)m->release_checks;
  if (m == (mstate)_gm_.treebins[uVar7]) {
    _gm_.treebins[uVar7] = (tbinptr)pmVar10;
    if (pmVar10 == (mstate)0x0) {
      bVar11 = (byte)uVar7 & 0x1f;
      _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      goto LAB_001068e0;
    }
  }
  else {
    if (pmVar9 < _gm_.least_addr) goto LAB_00106d81;
    if ((mstate)pmVar9->child[0] == m) {
      pmVar9->child[0] = (malloc_tree_chunk *)pmVar10;
    }
    else {
      pmVar9->child[1] = (malloc_tree_chunk *)pmVar10;
    }
LAB_001068e0:
    if (pmVar10 == (mstate)0x0) goto LAB_0010692d;
  }
  pcVar15 = _gm_.least_addr;
  if (pmVar10 < _gm_.least_addr) goto LAB_00106d81;
  pmVar10->trim_check = (size_t)pmVar9;
  pmVar9 = (malloc_tree_chunk *)m->dv;
  if (pmVar9 != (malloc_tree_chunk *)0x0) {
    if (pmVar9 < pcVar15) goto LAB_00106d81;
    pmVar10->dv = (mchunkptr)pmVar9;
    pmVar9->parent = (malloc_tree_chunk *)pmVar10;
  }
  pmVar2 = m->top;
  if (pmVar2 != (mchunkptr)0x0) {
    if (pmVar2 < pcVar15) goto LAB_00106d81;
    pmVar10->top = pmVar2;
    pmVar2[1].fd = (malloc_chunk *)pmVar10;
  }
LAB_0010692d:
  if (!bVar4) {
    return;
  }
LAB_00106936:
  if (pmVar1 < _gm_.least_addr) goto LAB_00106d81;
  uVar16 = pmVar1->head;
  if ((uVar16 & 2) == 0) {
    if (pmVar1 == (tbinptr)_gm_.top) {
      _gm_.topsize = (long)&p->prev_foot + _gm_.topsize;
      _gm_.top = (mchunkptr)m;
      m->dvsize = _gm_.topsize | 1;
      if (m != (mstate)_gm_.dv) {
        return;
      }
      _gm_.dvsize = 0;
      _gm_.dv = (mchunkptr)0x0;
      return;
    }
    if (pmVar1 == (tbinptr)_gm_.dv) {
      uVar16 = (long)&p->prev_foot + _gm_.dvsize;
      _gm_.dvsize = uVar16;
      _gm_.dv = (mchunkptr)m;
      m->dvsize = uVar16 | 1;
      *(ulong *)((long)m->smallbins + (uVar16 - 0x48)) = uVar16;
      return;
    }
    if (uVar16 < 0x100) {
      pmVar9 = pmVar1->fd;
      pmVar3 = pmVar1->bk;
      if ((pmVar9 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar16 >> 3) * 2)) &&
         ((pmVar9 < _gm_.least_addr || (pmVar9->bk != pmVar1)))) goto LAB_00106d81;
      if (pmVar3 == pmVar9) {
        bVar11 = (byte)(uVar16 >> 3) & 0x1f;
        _gm_.smallmap = _gm_.smallmap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
      }
      else {
        if ((pmVar3 != (malloc_tree_chunk *)(_gm_.smallbins + (uVar16 >> 3) * 2)) &&
           ((pmVar3 < _gm_.least_addr || (pmVar3->fd != pmVar1)))) goto LAB_00106d81;
        pmVar9->bk = pmVar3;
        pmVar3->fd = pmVar9;
      }
    }
    else {
      pmVar14 = pmVar1->bk;
      pmVar9 = pmVar1->parent;
      if (pmVar14 == pmVar1) {
        pmVar14 = pmVar1->child[1];
        if (pmVar14 != (tbinptr)0x0) {
          ppmVar8 = pmVar1->child + 1;
LAB_00106c87:
          do {
            if (pmVar14->child[1] == (malloc_tree_chunk *)0x0) {
              if (pmVar14->child[0] == (malloc_tree_chunk *)0x0) goto code_r0x00106c9b;
              ppmVar8 = pmVar14->child;
            }
            else {
              ppmVar8 = pmVar14->child + 1;
            }
            pmVar14 = *ppmVar8;
          } while( true );
        }
        pmVar14 = pmVar1->child[0];
        if (pmVar14 != (tbinptr)0x0) {
          ppmVar8 = pmVar1->child;
          goto LAB_00106c87;
        }
        pmVar14 = (tbinptr)0x0;
      }
      else {
        pmVar3 = pmVar1->fd;
        if (((pmVar3 < _gm_.least_addr) || (pmVar3->bk != pmVar1)) || (pmVar14->fd != pmVar1))
        goto LAB_00106d81;
        pmVar3->bk = pmVar14;
        pmVar14->fd = pmVar3;
      }
LAB_00106cab:
      if (pmVar9 != (malloc_tree_chunk *)0x0) {
        uVar7 = pmVar1->index;
        if (pmVar1 == _gm_.treebins[uVar7]) {
          _gm_.treebins[uVar7] = pmVar14;
          if (pmVar14 == (tbinptr)0x0) {
            bVar11 = (byte)uVar7 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
            goto LAB_00106d02;
          }
        }
        else {
          if (pmVar9 < _gm_.least_addr) goto LAB_00106d81;
          if (pmVar9->child[0] == pmVar1) {
            pmVar9->child[0] = pmVar14;
          }
          else {
            pmVar9->child[1] = pmVar14;
          }
LAB_00106d02:
          if (pmVar14 == (tbinptr)0x0) goto LAB_00106d43;
        }
        pcVar15 = _gm_.least_addr;
        if (pmVar14 < _gm_.least_addr) goto LAB_00106d81;
        pmVar14->parent = pmVar9;
        pmVar9 = pmVar1->child[0];
        if (pmVar9 != (malloc_tree_chunk *)0x0) {
          if (pmVar9 < pcVar15) goto LAB_00106d81;
          pmVar14->child[0] = pmVar9;
          pmVar9->parent = pmVar14;
        }
        pmVar9 = pmVar1->child[1];
        if (pmVar9 != (malloc_tree_chunk *)0x0) {
          if (pmVar9 < pcVar15) goto LAB_00106d81;
          pmVar14->child[1] = pmVar9;
          pmVar9->parent = pmVar14;
        }
      }
    }
LAB_00106d43:
    p = (mchunkptr)((long)&p->prev_foot + (uVar16 & 0xfffffffffffffff8));
    m->dvsize = (ulong)p | 1;
    *(mchunkptr *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk) = p;
    if (m == (mstate)_gm_.dv) {
      _gm_.dvsize = (size_t)p;
      return;
    }
  }
  else {
    pmVar1->head = uVar16 & 0xfffffffffffffffe;
    m->dvsize = (ulong)p | 1;
    *(mchunkptr *)((long)((malloc_state *)(m->smallbins + -9))->smallbins + (long)&p[-3].bk) = p;
  }
  if (p < (mchunkptr)0x100) {
    uVar16 = (ulong)p >> 3;
    if ((_gm_.smallmap >> ((uint)uVar16 & 0x1f) & 1) == 0) {
      _gm_.smallmap = _gm_.smallmap | 1 << ((byte)uVar16 & 0x1f);
      pmVar9 = (malloc_tree_chunk *)(_gm_.smallbins + uVar16 * 2);
    }
    else {
      pmVar9 = (malloc_tree_chunk *)_gm_.smallbins[uVar16 * 2 + 2];
      if ((malloc_tree_chunk *)_gm_.smallbins[uVar16 * 2 + 2] < _gm_.least_addr) {
LAB_00106d81:
        abort();
      }
    }
    _gm_.smallbins[uVar16 * 2 + 2] = (mchunkptr)m;
    pmVar9->bk = (malloc_tree_chunk *)m;
    m->topsize = (size_t)pmVar9;
    m->least_addr = (char *)(_gm_.smallbins + uVar16 * 2);
  }
  else {
    uVar7 = (uint)((ulong)p >> 8);
    if (uVar7 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0x1f;
      if (uVar7 < 0x10000) {
        uVar12 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar12 = (uint)(((ulong)p >> ((ulong)(byte)(0x26 - (char)(uVar12 ^ 0x1f)) & 0x3f) & 1) != 0)
                 + (uVar12 ^ 0x1f) * 2 ^ 0x3e;
      }
    }
    pmVar9 = (malloc_tree_chunk *)(_gm_.treebins + uVar12);
    *(uint *)&m->release_checks = uVar12;
    m->dv = (mchunkptr)0x0;
    m->top = (mchunkptr)0x0;
    if ((_gm_.treemap >> (uVar12 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar12 & 0x1f);
      pmVar9->prev_foot = (size_t)m;
      m->trim_check = (size_t)pmVar9;
      m->least_addr = (char *)m;
      m->topsize = (size_t)m;
    }
    else {
      pmVar9 = (malloc_tree_chunk *)pmVar9->prev_foot;
      bVar11 = 0x39 - (char)(uVar12 >> 1);
      if (uVar12 == 0x1f) {
        bVar11 = 0;
      }
      lVar13 = (long)p << (bVar11 & 0x3f);
      do {
        if ((mchunkptr)(pmVar9->head & 0xfffffffffffffff8) == p) {
          if ((_gm_.least_addr <= pmVar9) && (pmVar3 = pmVar9->fd, _gm_.least_addr <= pmVar3)) {
            pmVar3->bk = (malloc_tree_chunk *)m;
            pmVar9->fd = (malloc_tree_chunk *)m;
            m->topsize = (size_t)pmVar3;
            m->least_addr = (char *)pmVar9;
            m->trim_check = 0;
            return;
          }
          goto LAB_00106d81;
        }
        pmVar3 = *(malloc_tree_chunk **)((long)pmVar9 + (lVar13 >> 0x3f) * -8 + 0x20);
        pmVar5 = pmVar3;
        if (pmVar3 == (malloc_tree_chunk *)0x0) {
          pcVar15 = (char *)((long)pmVar9 + (lVar13 >> 0x3f) * -8 + 0x20);
          if (pcVar15 < _gm_.least_addr) goto LAB_00106d81;
          *(mstate *)pcVar15 = m;
          m->trim_check = (size_t)pmVar9;
          m->least_addr = (char *)m;
          m->topsize = (size_t)m;
          pmVar5 = pmVar9;
        }
        pmVar9 = pmVar5;
        lVar13 = lVar13 * 2;
      } while (pmVar3 != (malloc_tree_chunk *)0x0);
    }
  }
  return;
}

Assistant:

static void dispose_chunk(mstate m, mchunkptr p, size_t psize) {
  mchunkptr next = chunk_plus_offset(p, psize);
  if (!pinuse(p)) {
    mchunkptr prev;
    size_t prevsize = p->prev_foot;
    if (is_mmapped(p)) {
      psize += prevsize + MMAP_FOOT_PAD;
      if (CALL_MUNMAP((char*)p - prevsize, psize) == 0)
        m->footprint -= psize;
      return;
    }
    prev = chunk_minus_offset(p, prevsize);
    psize += prevsize;
    p = prev;
    if (RTCHECK(ok_address(m, prev))) { /* consolidate backward */
      if (p != m->dv) {
        unlink_chunk(m, p, prevsize);
      }
      else if ((next->head & INUSE_BITS) == INUSE_BITS) {
        m->dvsize = psize;
        set_free_with_pinuse(p, psize, next);
        return;
      }
    }
    else {
      CORRUPTION_ERROR_ACTION(m);
      return;
    }
  }
  if (RTCHECK(ok_address(m, next))) {
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == m->top) {
        size_t tsize = m->topsize += psize;
        m->top = p;
        p->head = tsize | PINUSE_BIT;
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        return;
      }
      else if (next == m->dv) {
        size_t dsize = m->dvsize += psize;
        m->dv = p;
        set_size_and_pinuse_of_free_chunk(p, dsize);
        return;
      }
      else {
        size_t nsize = chunksize(next);
        psize += nsize;
        unlink_chunk(m, next, nsize);
        set_size_and_pinuse_of_free_chunk(p, psize);
        if (p == m->dv) {
          m->dvsize = psize;
          return;
        }
      }
    }
    else {
      set_free_with_pinuse(p, psize, next);
    }
    insert_chunk(m, p, psize);
  }
  else {
    CORRUPTION_ERROR_ACTION(m);
  }
}